

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_bitmap_intersect_with_range(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  _Bool _Var1;
  uint64_t uVar2;
  ulong in_RDX;
  ulong in_RSI;
  roaring64_iterator_t it;
  _Bool local_d9;
  uint64_t in_stack_ffffffffffffff30;
  roaring64_iterator_t *in_stack_ffffffffffffff38;
  _Bool in_stack_ffffffffffffffb7;
  roaring64_iterator_t *in_stack_ffffffffffffffb8;
  roaring64_bitmap_t *in_stack_ffffffffffffffc0;
  _Bool local_1;
  
  if (in_RSI < in_RDX) {
    roaring64_iterator_init_at
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
    _Var1 = roaring64_iterator_move_equalorlarger
                      (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (_Var1) {
      _Var1 = roaring64_iterator_has_value((roaring64_iterator_t *)&stack0xffffffffffffff28);
      local_d9 = false;
      if (_Var1) {
        uVar2 = roaring64_iterator_value((roaring64_iterator_t *)&stack0xffffffffffffff28);
        local_d9 = uVar2 < in_RDX;
      }
      local_1 = local_d9;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool roaring64_bitmap_intersect_with_range(const roaring64_bitmap_t *r,
                                           uint64_t min, uint64_t max) {
    if (min >= max) {
        return false;
    }
    roaring64_iterator_t it;
    roaring64_iterator_init_at(r, &it, /*first=*/true);
    if (!roaring64_iterator_move_equalorlarger(&it, min)) {
        return false;
    }
    return roaring64_iterator_has_value(&it) &&
           roaring64_iterator_value(&it) < max;
}